

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

void Service_Call_single(UA_Server *server,UA_Session *session,UA_CallMethodRequest *request,
                        UA_CallMethodResult *result)

{
  UA_Boolean UVar1;
  UA_StatusCode UVar2;
  UA_MethodNode *ofMethod;
  UA_Node *n2;
  UA_VariableNode *pUVar3;
  UA_Variant *pUVar4;
  UA_String UVar5;
  UA_VariableNode *outputArguments;
  UA_VariableNode *inputArguments;
  size_t i;
  UA_NodeId hasSubTypeNodeId;
  UA_NodeId hasComponentNodeId;
  UA_Boolean found;
  UA_ObjectNode *withObject;
  UA_MethodNode *methodCalled;
  UA_CallMethodResult *result_local;
  UA_CallMethodRequest *request_local;
  UA_Session *session_local;
  UA_Server *server_local;
  
  ofMethod = (UA_MethodNode *)UA_NodeStore_get(server->nodestore,&request->methodId);
  if (ofMethod == (UA_MethodNode *)0x0) {
    result->statusCode = 0x80750000;
  }
  else if (ofMethod->nodeClass == UA_NODECLASS_METHOD) {
    if ((((ofMethod->executable & 1U) == 0) || ((ofMethod->userExecutable & 1U) == 0)) ||
       (ofMethod->attachedMethod == (UA_MethodCallback)0x0)) {
      result->statusCode = 0x803b0000;
    }
    else {
      n2 = UA_NodeStore_get(server->nodestore,&request->objectId);
      if (n2 == (UA_Node *)0x0) {
        result->statusCode = 0x80330000;
      }
      else if ((n2->nodeClass == UA_NODECLASS_OBJECT) || (n2->nodeClass == UA_NODECLASS_OBJECTTYPE))
      {
        hasComponentNodeId.identifier.guid.data4[7] = '\0';
        UA_NODEID_NUMERIC((UA_NodeId *)((long)&hasSubTypeNodeId.identifier + 8),0,0x2f);
        UA_NODEID_NUMERIC((UA_NodeId *)&i,0,0x2d);
        inputArguments = (UA_VariableNode *)0x0;
        while ((inputArguments < (UA_VariableNode *)ofMethod->referencesSize &&
               ((((ofMethod->references[(long)inputArguments].isInverse & 1U) == 0 ||
                 (UVar1 = UA_NodeId_equal(&ofMethod->references[(long)inputArguments].targetId.
                                           nodeId,&n2->nodeId), !UVar1)) ||
                (hasComponentNodeId.identifier.guid.data4[7] =
                      isNodeInTree(server->nodestore,
                                   &ofMethod->references[(long)inputArguments].referenceTypeId,
                                   (UA_NodeId *)((long)&hasSubTypeNodeId.identifier + 8),
                                   (UA_NodeId *)&i,1),
                !(bool)hasComponentNodeId.identifier.guid.data4[7]))))) {
          inputArguments = (UA_VariableNode *)((long)&(inputArguments->nodeId).namespaceIndex + 1);
        }
        if (hasComponentNodeId.identifier.guid.data4[7] == '\0') {
          result->statusCode = 0x80750000;
        }
        else {
          UVar5 = UA_STRING("InputArguments");
          pUVar3 = getArgumentsVariableNode(server,ofMethod,UVar5);
          if (pUVar3 == (UA_VariableNode *)0x0) {
            if (request->inputArgumentsSize != 0) {
              result->statusCode = 0x80ab0000;
              return;
            }
          }
          else {
            UVar2 = argumentsConformsToDefinition
                              (server,pUVar3,request->inputArgumentsSize,request->inputArguments);
            result->statusCode = UVar2;
            if (result->statusCode != 0) {
              return;
            }
          }
          result->outputArgumentsSize = 0;
          UVar5 = UA_STRING("OutputArguments");
          pUVar3 = getArgumentsVariableNode(server,ofMethod,UVar5);
          if (pUVar3 != (UA_VariableNode *)0x0) {
            pUVar4 = (UA_Variant *)
                     UA_Array_new(*(size_t *)((long)&pUVar3->value + 0x18),UA_TYPES + 0x17);
            result->outputArguments = pUVar4;
            if (result->outputArguments == (UA_Variant *)0x0) {
              result->statusCode = 0x80030000;
              return;
            }
            result->outputArgumentsSize = *(size_t *)((long)&pUVar3->value + 0x18);
          }
          methodCallSession = session;
          UVar2 = (*ofMethod->attachedMethod)
                            (ofMethod->methodHandle,n2->nodeId,request->inputArgumentsSize,
                             request->inputArguments,result->outputArgumentsSize,
                             result->outputArguments);
          result->statusCode = UVar2;
          methodCallSession = (UA_Session *)0x0;
        }
      }
      else {
        result->statusCode = 0x805f0000;
      }
    }
  }
  else {
    result->statusCode = 0x805f0000;
  }
  return;
}

Assistant:

void
Service_Call_single(UA_Server *server, UA_Session *session,
                    const UA_CallMethodRequest *request,
                    UA_CallMethodResult *result) {
    /* Get/verify the method node */
    const UA_MethodNode *methodCalled =
        (const UA_MethodNode*)UA_NodeStore_get(server->nodestore, &request->methodId);
    if(!methodCalled) {
        result->statusCode = UA_STATUSCODE_BADMETHODINVALID;
        return;
    }
    if(methodCalled->nodeClass != UA_NODECLASS_METHOD) {
        result->statusCode = UA_STATUSCODE_BADNODECLASSINVALID;
        return;
    }
    if(!methodCalled->executable || !methodCalled->userExecutable || !methodCalled->attachedMethod) {
        result->statusCode = UA_STATUSCODE_BADNOTWRITABLE; // There is no NOTEXECUTABLE?
        return;
    }

    /* Get/verify the object node */
    const UA_ObjectNode *withObject =
        (const UA_ObjectNode*)UA_NodeStore_get(server->nodestore, &request->objectId);
    if(!withObject) {
        result->statusCode = UA_STATUSCODE_BADNODEIDINVALID;
        return;
    }
    if(withObject->nodeClass != UA_NODECLASS_OBJECT && withObject->nodeClass != UA_NODECLASS_OBJECTTYPE) {
        result->statusCode = UA_STATUSCODE_BADNODECLASSINVALID;
        return;
    }

    /* Verify method/object relations. Object must have a hasComponent or a
     * subtype of hasComponent reference to the method node. Therefore, check
     * every reference between the parent object and the method node if there is
     * a hasComponent (or subtype) reference */
    UA_Boolean found = false;
    UA_NodeId hasComponentNodeId = UA_NODEID_NUMERIC(0,UA_NS0ID_HASCOMPONENT);
    UA_NodeId hasSubTypeNodeId = UA_NODEID_NUMERIC(0,UA_NS0ID_HASSUBTYPE);
    for(size_t i = 0; i < methodCalled->referencesSize; ++i) {
        if(methodCalled->references[i].isInverse &&
           UA_NodeId_equal(&methodCalled->references[i].targetId.nodeId, &withObject->nodeId)) {
            found = isNodeInTree(server->nodestore, &methodCalled->references[i].referenceTypeId,
                                 &hasComponentNodeId, &hasSubTypeNodeId, 1);
            if(found)
                break;
        }
    }
    if(!found) {
        result->statusCode = UA_STATUSCODE_BADMETHODINVALID;
        return;
    }

    /* Verify Input Argument count, types and sizes */
    const UA_VariableNode *inputArguments =
        getArgumentsVariableNode(server, methodCalled, UA_STRING("InputArguments"));

    if(!inputArguments) {
        if(request->inputArgumentsSize > 0) {
            result->statusCode = UA_STATUSCODE_BADINVALIDARGUMENT;
            return;
        }
    } else {
        result->statusCode = argumentsConformsToDefinition(server, inputArguments,
                                                           request->inputArgumentsSize,
                                                           request->inputArguments);
        if(result->statusCode != UA_STATUSCODE_GOOD)
            return;
    }

    /* Allocate the output arguments */
    result->outputArgumentsSize = 0; /* the default */
    const UA_VariableNode *outputArguments =
        getArgumentsVariableNode(server, methodCalled, UA_STRING("OutputArguments"));
    if(outputArguments) {
        result->outputArguments = UA_Array_new(outputArguments->value.data.value.value.arrayLength,
                                               &UA_TYPES[UA_TYPES_VARIANT]);
        if(!result->outputArguments) {
            result->statusCode = UA_STATUSCODE_BADOUTOFMEMORY;
            return;
        }
        result->outputArgumentsSize = outputArguments->value.data.value.value.arrayLength;
    }

    /* Call the method */
#if defined(UA_ENABLE_METHODCALLS) && defined(UA_ENABLE_SUBSCRIPTIONS)
    methodCallSession = session;
#endif
    result->statusCode = methodCalled->attachedMethod(methodCalled->methodHandle, withObject->nodeId,
                                                      request->inputArgumentsSize, request->inputArguments,
                                                      result->outputArgumentsSize, result->outputArguments);
#if defined(UA_ENABLE_METHODCALLS) && defined(UA_ENABLE_SUBSCRIPTIONS)
    methodCallSession = NULL;
#endif

    /* TODO: Verify Output matches the argument definition */
}